

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  SPIRVariable *pSVar7;
  undefined8 uVar8;
  size_type sVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  ulong uVar12;
  Resource *pRVar13;
  ulong uVar14;
  size_type *psVar15;
  long lVar16;
  Resource *pRVar17;
  ulong uVar18;
  size_t i;
  ulong uVar19;
  
  uVar18 = (this->super_VectorView<Resource>).buffer_size;
  uVar19 = uVar18 + 1;
  if (uVar19 >> 0x3a == 0) {
    uVar14 = this->buffer_capacity;
    if (uVar14 < uVar19) {
      uVar12 = 8;
      if (8 < uVar14) {
        uVar12 = uVar14;
      }
      do {
        uVar14 = uVar12;
        uVar12 = uVar14 * 2;
      } while (uVar14 < uVar19);
      if (uVar14 < 9) {
        pRVar13 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar13 = (Resource *)malloc(uVar14 << 6);
        if (pRVar13 == (Resource *)0x0) goto LAB_0023a169;
      }
      pRVar17 = (this->super_VectorView<Resource>).ptr;
      if ((uVar18 != 0) && (pRVar13 != pRVar17)) {
        lVar16 = 0x18;
        uVar19 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pRVar13->var + lVar16);
          pRVar17 = (this->super_VectorView<Resource>).ptr;
          puVar4 = (undefined8 *)((long)&pRVar17->var + lVar16);
          *(undefined8 *)((long)pRVar13 + lVar16 + -0x18) =
               *(undefined8 *)((long)pRVar17 + lVar16 + -0x18);
          *(undefined8 **)((long)pRVar13 + lVar16 + -0x10) = puVar3;
          puVar5 = *(undefined8 **)((long)pRVar17 + lVar16 + -0x10);
          if (puVar4 == puVar5) {
            uVar8 = puVar4[1];
            *puVar3 = *puVar4;
            puVar3[1] = uVar8;
          }
          else {
            *(undefined8 **)((long)pRVar13 + lVar16 + -0x10) = puVar5;
            *(undefined8 *)((long)&pRVar13->var + lVar16) = *puVar4;
          }
          *(undefined8 *)((long)pRVar13 + lVar16 + -8) =
               *(undefined8 *)((long)pRVar17 + lVar16 + -8);
          *(undefined8 **)((long)pRVar17 + lVar16 + -0x10) = puVar4;
          *(undefined8 *)((long)pRVar17 + lVar16 + -8) = 0;
          *(undefined1 *)((long)&pRVar17->var + lVar16) = 0;
          *(undefined4 *)((long)&(pRVar13->name).field_2 + lVar16) =
               *(undefined4 *)((long)&(pRVar17->name).field_2 + lVar16);
          puVar3 = (undefined8 *)((long)&(pRVar17->name)._M_dataplus._M_p + lVar16);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&(pRVar13->name)._M_dataplus._M_p + lVar16);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          pRVar17 = (this->super_VectorView<Resource>).ptr;
          pvVar6 = *(void **)((long)pRVar17 + lVar16 + -0x10);
          if ((void *)((long)&pRVar17->var + lVar16) != pvVar6) {
            operator_delete(pvVar6);
          }
          uVar19 = uVar19 + 1;
          uVar18 = (this->super_VectorView<Resource>).buffer_size;
          lVar16 = lVar16 + 0x40;
        } while (uVar19 < uVar18);
        pRVar17 = (this->super_VectorView<Resource>).ptr;
      }
      if (pRVar17 != (Resource *)&this->stack_storage) {
        free(pRVar17);
        uVar18 = (this->super_VectorView<Resource>).buffer_size;
      }
      (this->super_VectorView<Resource>).ptr = pRVar13;
      this->buffer_capacity = uVar14;
    }
    else {
      pRVar13 = (this->super_VectorView<Resource>).ptr;
    }
    pRVar17 = pRVar13 + uVar18;
    psVar15 = &(pRVar17->name)._M_string_length;
    pRVar17->var = t->var;
    pRVar17->discrete_descriptor_alias = (SPIRVariable *)psVar15;
    pSVar7 = (SPIRVariable *)(t->name)._M_dataplus._M_p;
    paVar1 = &(t->name).field_2;
    if (pSVar7 == (SPIRVariable *)paVar1) {
      sVar9 = *(size_type *)((long)&(t->name).field_2 + 8);
      *psVar15 = paVar1->_M_allocated_capacity;
      (pRVar17->name).field_2._M_allocated_capacity = sVar9;
    }
    else {
      pRVar13[uVar18].discrete_descriptor_alias = pSVar7;
      pRVar13[uVar18].name._M_string_length = paVar1->_M_allocated_capacity;
    }
    pRVar13[uVar18].name._M_dataplus._M_p = (pointer)(t->name)._M_string_length;
    (t->name)._M_dataplus._M_p = (pointer)paVar1;
    (t->name)._M_string_length = 0;
    (t->name).field_2._M_local_buf[0] = '\0';
    pRVar13[uVar18].plane = t->overlapping_var_id;
    uVar10 = t->plane_count;
    uVar11 = t->plane;
    *(undefined8 *)((long)&pRVar13[uVar18].name.field_2 + 8) = *(undefined8 *)&t->basetype;
    pRVar13[uVar18].basetype = uVar10;
    pRVar13[uVar18].index = uVar11;
    psVar2 = &(this->super_VectorView<Resource>).buffer_size;
    *psVar2 = *psVar2 + 1;
    return;
  }
LAB_0023a169:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}